

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O3

void uv::TCPClient::AfterSend(uv_write_t *req,int status)

{
  size_t *psVar1;
  TCPClient *this;
  char *pcVar2;
  FILE *__stream;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  _List_node_base *p_Var7;
  ILog4zManager *pIVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  ulong *in_FS_OFFSET;
  string local_70;
  string local_50;
  
  this = (TCPClient *)req->data;
  if (-1 < status) {
    send_inl(this,req);
    return;
  }
  if ((this->writeparam_list_).
      super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl._M_node.
      _M_size < 0x15) {
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)req;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(this->writeparam_list_).
              super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    free(req[1].data);
    free(req);
  }
  pcVar2 = (char *)*in_FS_OFFSET;
  builtin_strncpy(pcVar2 + -0x800,"send error:",0xc);
  pcVar12 = pcVar2 + -0x7f5;
  GetUVError_abi_cxx11_(&local_50,status);
  uVar4 = snprintf(pcVar12,0x7f5,"%s",local_50._M_dataplus._M_p);
  uVar3 = 0;
  if ((int)uVar4 < 0) {
LAB_0011b470:
    uVar4 = uVar3;
    *pcVar12 = '\0';
  }
  else if (0x7f4 < uVar4) {
    pcVar12 = pcVar2 + -1;
    uVar3 = 0x7f5;
    goto LAB_0011b470;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar12 = pcVar2 + -0x800 + (ulong)uVar4 + 0xb;
  iVar10 = (int)pcVar2;
  if (uVar4 < 0x7f5) {
    iVar11 = iVar10 - (int)pcVar12;
    iVar5 = snprintf(pcVar12,(long)iVar11,"%s"," ( ");
    pcVar9 = pcVar12;
    iVar6 = 0;
    if (iVar5 < 0) {
LAB_0011b4e4:
      *pcVar9 = '\0';
    }
    else {
      iVar6 = iVar5;
      if (iVar11 <= iVar5) {
        pcVar9 = pcVar2 + -1;
        iVar6 = iVar11;
        goto LAB_0011b4e4;
      }
    }
    pcVar12 = pcVar12 + iVar6;
  }
  if (pcVar12 < pcVar2) {
    iVar11 = iVar10 - (int)pcVar12;
    iVar5 = snprintf(pcVar12,(long)iVar11,"%s"," ");
    pcVar9 = pcVar12;
    iVar6 = 0;
    if (iVar5 < 0) {
LAB_0011b52c:
      *pcVar9 = '\0';
    }
    else {
      iVar6 = iVar5;
      if (iVar11 <= iVar5) {
        pcVar9 = pcVar2 + -1;
        iVar6 = iVar11;
        goto LAB_0011b52c;
      }
    }
    pcVar12 = pcVar12 + iVar6;
  }
  if (pcVar12 < pcVar2) {
    iVar11 = iVar10 - (int)pcVar12;
    iVar5 = snprintf(pcVar12,(long)iVar11,"%s"," ) : ");
    pcVar9 = pcVar12;
    iVar6 = 0;
    if (iVar5 < 0) {
LAB_0011b574:
      *pcVar9 = '\0';
    }
    else {
      iVar6 = iVar5;
      if (iVar11 <= iVar5) {
        pcVar9 = pcVar2 + -1;
        iVar6 = iVar11;
        goto LAB_0011b574;
      }
    }
    pcVar12 = pcVar12 + iVar6;
  }
  if (pcVar12 < pcVar2) {
    iVar10 = iVar10 - (int)pcVar12;
    iVar6 = snprintf(pcVar12,(long)iVar10,"%d",0x187);
    if (-1 < iVar6) {
      if (iVar6 < iVar10) goto LAB_0011b5b6;
      pcVar12 = pcVar2 + -1;
    }
    *pcVar12 = '\0';
  }
LAB_0011b5b6:
  pIVar8 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar8->_vptr_ILog4zManager[8])(pIVar8,0,3,pcVar2 + -0x800);
  __stream = _stderr;
  GetUVError_abi_cxx11_(&local_70,status);
  fprintf(__stream,"send error %s\n",local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TCPClient::AfterSend(uv_write_t* req, int status)
{
    TCPClient* theclass = (TCPClient*)req->data;
    if (status < 0) {
        if (theclass->writeparam_list_.size() > MAXLISTSIZE) {
            FreeWriteParam((write_param*)req);
        } else {
            theclass->writeparam_list_.push_back((write_param*)req);
        }
        LOGE("send error:" << GetUVError(status));
        fprintf(stderr, "send error %s\n", GetUVError(status).c_str());
        return;
    }
    theclass->send_inl(req);
}